

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_suite.cpp
# Opt level: O0

void array_suite::test_empty(void)

{
  string local_208 [36];
  undefined4 local_1e4;
  size_type local_1e0;
  undefined4 local_1d4;
  size_type local_1d0 [3];
  undefined1 local_1b8 [8];
  writer writer;
  ostringstream local_180 [8];
  ostringstream result;
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  trial::protocol::json::basic_writer<char,16ul>::basic_writer<std::__cxx11::ostringstream>
            ((basic_writer<char,16ul> *)local_1b8,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  local_1d0[0] = trial::protocol::json::basic_writer<char,_16UL>::
                 value<trial::protocol::json::token::begin_array>
                           ((basic_writer<char,_16UL> *)local_1b8);
  local_1d4 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("writer.value<token::begin_array>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/writer_suite.cpp"
             ,0xe6,"void array_suite::test_empty()",local_1d0,&local_1d4);
  local_1e0 = trial::protocol::json::basic_writer<char,_16UL>::
              value<trial::protocol::json::token::end_array>((basic_writer<char,_16UL> *)local_1b8);
  local_1e4 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("writer.value<token::end_array>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/writer_suite.cpp"
             ,0xe7,"void array_suite::test_empty()",&local_1e0,&local_1e4);
  std::__cxx11::ostringstream::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[3]>
            ("result.str()","\"[]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/writer_suite.cpp"
             ,0xe8,"void array_suite::test_empty()",local_208,"[]");
  std::__cxx11::string::~string(local_208);
  trial::protocol::json::basic_writer<char,_16UL>::~basic_writer
            ((basic_writer<char,_16UL> *)local_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void test_empty()
{
    std::ostringstream result;
    json::writer writer(result);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value<token::begin_array>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value<token::end_array>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "[]");
}